

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-create.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  char cVar5;
  char cVar6;
  size_t i;
  ostream *poVar7;
  ImageProvider *this;
  Buffer *__p;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  logic_error *plVar11;
  bool bVar12;
  int iVar13;
  string *filter_00;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  pointer color_space_00;
  long lVar19;
  ulong uVar20;
  QPDFObjectHandle QVar21;
  long local_240;
  QPDF pdf;
  QPDF pdf_1;
  undefined8 local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  shared_ptr<Buffer> actual_data;
  QPDFObjectHandle color_space;
  QPDFObjectHandle image_dict;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filters;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  color_spaces;
  QPDFObjectHandle image;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> provider;
  QPDFObjectHandle filter;
  Pl_Buffer b_p;
  string desired_filter;
  QPDFWriter local_f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  char local_e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  QPDFObjectHandle font;
  string desired_color_space;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  long local_a0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_90;
  QPDFPageDocumentHelper dh;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  images;
  long local_48;
  long local_38;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc == 2) {
    pcVar1 = argv[1];
    QPDF::QPDF(&pdf);
    QPDF::emptyPDF();
    operator____qpdf(local_e8,0x1091ac);
    QVar21.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&pdf;
    QVar21.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&font;
    QPDF::makeIndirectObject(QVar21);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
    color_spaces.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    color_spaces.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    color_spaces.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&color_spaces,
               (char (*) [12])"/DeviceCMYK");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[11]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&color_spaces,
               (char (*) [11])"/DeviceRGB");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&color_spaces,
               (char (*) [12])"/DeviceGray");
    filters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    filters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    filters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filters,
               (char (*) [5])"null");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[11]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filters,
               (char (*) [11])"/DCTDecode");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[17]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filters,
               (char (*) [17])"/RunLengthDecode");
    QPDFPageDocumentHelper::QPDFPageDocumentHelper(&dh,&pdf);
    pbVar3 = color_spaces.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (color_space_00 =
              color_spaces.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        pbVar2 = filters.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        filter_00 = filters.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, color_space_00 != pbVar3;
        color_space_00 = color_space_00 + 1) {
      for (; filter_00 != pbVar2; filter_00 = filter_00 + 1) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_90,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&font);
        add_page(&dh,(QPDFObjectHandle *)&local_90,color_space_00,filter_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      }
    }
    QPDFWriter::QPDFWriter(local_f8,&pdf,pcVar1);
    QPDFWriter::write();
    lVar14 = (long)color_spaces.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)color_spaces.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    lVar19 = (long)filters.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)filters.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    QPDF::QPDF(&pdf_1);
    QPDF::processFile((char *)&pdf_1,pcVar1);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&b_p,&pdf_1);
    QPDFPageDocumentHelper::getAllPages();
    uVar15 = lVar14 >> 5;
    uVar20 = lVar19 >> 5;
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&b_p);
    if (uVar20 * uVar15 - (local_a0 - _pages) / 0x38 == 0) {
      local_240 = 1;
      bVar12 = false;
      lVar14 = _pages;
      while( true ) {
        if (lVar14 == local_a0) {
          if (bVar12) {
            plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar11,"errors found");
            __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          poVar7 = std::operator<<((ostream *)&std::cout,"all checks passed");
          std::endl<char,std::char_traits<char>>(poVar7);
          std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&pages);
          QPDF::~QPDF(&pdf_1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
          QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&dh);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&filters);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&color_spaces);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&font.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          QPDF::~QPDF(&pdf);
          return 0;
        }
        QPDFPageObjectHelper::getImages_abi_cxx11_();
        if (local_38 != 1) break;
        std::__cxx11::string::string
                  ((string *)&desired_color_space,
                   (string *)
                   (color_spaces.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (local_240 - 1U) / uVar15));
        std::__cxx11::string::string
                  ((string *)&desired_filter,
                   (string *)
                   (filters.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (local_240 - 1U) % uVar20));
        bVar4 = std::operator==(&desired_filter,"null");
        if (bVar4) {
          std::__cxx11::string::assign((char *)&desired_filter);
        }
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&image,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x40));
        QPDFObjectHandle::getDict();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&b_p,"/ColorSpace",(allocator<char> *)&filter);
        QPDFObjectHandle::getKey((string *)&color_space);
        std::__cxx11::string::~string((string *)&b_p);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&b_p,"/Filter",(allocator<char> *)&actual_data);
        QPDFObjectHandle::getKey((string *)&filter);
        std::__cxx11::string::~string((string *)&b_p);
        cVar5 = QPDFObjectHandle::isNameAndEquals((string *)&filter);
        if (cVar5 == '\0') {
          poVar7 = std::operator<<((ostream *)&std::cout,"page ");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,": expected filter ");
          poVar7 = std::operator<<(poVar7,(string *)&desired_filter);
          poVar7 = std::operator<<(poVar7,"; actual filter = ");
          QPDFObjectHandle::unparse_abi_cxx11_();
          poVar7 = std::operator<<(poVar7,(string *)&b_p);
          std::endl<char,std::char_traits<char>>(poVar7);
          std::__cxx11::string::~string((string *)&b_p);
          bVar12 = true;
        }
        cVar6 = QPDFObjectHandle::isNameAndEquals((string *)&color_space);
        if (cVar6 == '\0') {
          poVar7 = std::operator<<((ostream *)&std::cout,"page ");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,": expected color space ");
          poVar7 = std::operator<<(poVar7,(string *)&desired_color_space);
          poVar7 = std::operator<<(poVar7,"; actual color space = ");
          QPDFObjectHandle::unparse_abi_cxx11_();
          poVar7 = std::operator<<(poVar7,(string *)&b_p);
          std::endl<char,std::char_traits<char>>(poVar7);
          std::__cxx11::string::~string((string *)&b_p);
          bVar12 = true;
        }
        else if (cVar5 != '\0') {
          QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&actual_data);
          this = (ImageProvider *)operator_new(0x88);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&b_p,"null",(allocator<char> *)&provider);
          ImageProvider::ImageProvider(this,&desired_color_space,(string *)&b_p);
          std::__cxx11::string::~string((string *)&b_p);
          std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<ImageProvider,void>
                    ((__shared_ptr<QPDFObjectHandle::StreamDataProvider,(__gnu_cxx::_Lock_policy)2>
                      *)&provider,this);
          Pl_Buffer::Pl_Buffer(&b_p,"get image data",(Pipeline *)0x0);
          local_218 = 0;
          (**(code **)(*(long *)provider.
                                super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 0x10))
                    (provider.
                     super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&local_218,(string *)&b_p);
          __p = (Buffer *)Pl_Buffer::getBuffer();
          std::__shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Buffer,void>
                    ((__shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2> *)&local_218,__p);
          lVar19 = Buffer::getSize();
          lVar8 = Buffer::getSize();
          if (lVar19 == lVar8) {
            lVar19 = Buffer::getBuffer();
            lVar8 = Buffer::getBuffer();
            uVar9 = Buffer::getSize();
            bVar4 = std::operator==(&desired_filter,"/DCTDecode");
            uVar16 = 0;
            iVar18 = 0;
            if (bVar4) {
              iVar18 = -10;
            }
            iVar17 = 0;
            if (bVar4) {
              iVar17 = 10;
            }
            bVar4 = std::operator==(&desired_filter,"/DCTDecode");
            for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
              iVar13 = (uint)*(byte *)(lVar19 + uVar10) - (uint)*(byte *)(lVar8 + uVar10);
              uVar16 = uVar16 + (iVar13 < iVar18 || iVar17 < iVar13);
            }
            uVar9 = uVar9 / 0x28;
            if (!bVar4) {
              uVar9 = 0;
            }
            if (uVar9 < uVar16) {
              poVar7 = std::operator<<((ostream *)&std::cout,"page ");
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              poVar7 = std::operator<<(poVar7,": ");
              poVar7 = std::operator<<(poVar7,(string *)&desired_color_space);
              poVar7 = std::operator<<(poVar7,", ");
              poVar7 = std::operator<<(poVar7,(string *)&desired_filter);
              poVar7 = std::operator<<(poVar7,": mismatches: ");
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              poVar7 = std::operator<<(poVar7," of ");
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              bVar12 = true;
              std::endl<char,std::char_traits<char>>(poVar7);
            }
          }
          else {
            poVar7 = std::operator<<((ostream *)&std::cout,"page ");
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            poVar7 = std::operator<<(poVar7,": image data length mismatch");
            bVar12 = true;
            std::endl<char,std::char_traits<char>>(poVar7);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_210);
          Pl_Buffer::~Pl_Buffer(&b_p);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&provider.
                      super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&actual_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    );
        }
        local_240 = local_240 + 1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&filter.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&color_space.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&image_dict.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&image.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)&desired_filter);
        std::__cxx11::string::~string((string *)&desired_color_space);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                     *)&images);
        lVar14 = lVar14 + 0x38;
      }
      plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar11,"incorrect number of images on page");
      __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  else {
    usage();
  }
  plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar11,"incorrect number of pages");
  __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 2) {
        usage();
    }
    char const* filename = argv[1];

    try {
        create_pdf(filename);
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    return 0;
}